

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O0

int waitproxyconnect_getsock(connectdata *conn,curl_socket_t *sock,int numsocks)

{
  int numsocks_local;
  curl_socket_t *sock_local;
  connectdata *conn_local;
  
  if (numsocks == 0) {
    conn_local._4_4_ = 0;
  }
  else {
    *sock = conn->sock[0];
    if (conn->connect_state == (http_connect_state *)0x0) {
      conn_local._4_4_ = 0x10000;
    }
    else {
      conn_local._4_4_ = 1;
    }
  }
  return conn_local._4_4_;
}

Assistant:

static int waitproxyconnect_getsock(struct connectdata *conn,
                                    curl_socket_t *sock,
                                    int numsocks)
{
  if(!numsocks)
    return GETSOCK_BLANK;

  sock[0] = conn->sock[FIRSTSOCKET];

  /* when we've sent a CONNECT to a proxy, we should rather wait for the
     socket to become readable to be able to get the response headers */
  if(conn->connect_state)
    return GETSOCK_READSOCK(0);

  return GETSOCK_WRITESOCK(0);
}